

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyOpsBufferStorageTestCase::initReferenceData(CopyOpsBufferStorageTestCase *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  unsigned_short uVar3;
  ulong uVar4;
  unsigned_short uVar5;
  uint n_ref_data_buffer;
  long lVar6;
  
  uVar1 = this->m_sparse_bo_size_rounded;
  uVar5 = 1;
  lVar6 = 0;
  do {
    puVar2 = (unsigned_short *)operator_new__((ulong)(uVar1 & 0xfffffffe));
    this->m_ref_data[lVar6] = puVar2;
    if (1 < uVar1) {
      uVar4 = 0;
      uVar3 = uVar5;
      do {
        puVar2[uVar4] = uVar3;
        uVar4 = uVar4 + 1;
        uVar3 = uVar3 + uVar5;
      } while (uVar1 >> 1 != uVar4);
    }
    lVar6 = lVar6 + 1;
    uVar5 = uVar5 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

void CopyOpsBufferStorageTestCase::initReferenceData()
{
	DE_ASSERT(m_sparse_bo_size_rounded != 0);
	DE_ASSERT((m_sparse_bo_size_rounded % 2) == 0);
	DE_ASSERT(sizeof(short) == 2);

	for (unsigned int n_ref_data_buffer = 0; n_ref_data_buffer < sizeof(m_ref_data) / sizeof(m_ref_data[0]);
		 ++n_ref_data_buffer)
	{
		DE_ASSERT(m_ref_data[n_ref_data_buffer] == DE_NULL);

		m_ref_data[n_ref_data_buffer] = new unsigned short[m_sparse_bo_size_rounded / 2];

		/* Write reference values. */
		for (unsigned int n_short_value = 0; n_short_value < m_sparse_bo_size_rounded / 2; ++n_short_value)
		{
			m_ref_data[n_ref_data_buffer][n_short_value] =
				(unsigned short)((n_ref_data_buffer + 1) * (n_short_value + 1));
		}
	} /* for (all reference data buffers) */
}